

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_pivot.cpp
# Opt level: O2

PivotColumn * __thiscall
duckdb::Transformer::TransformPivotColumn
          (PivotColumn *__return_storage_ptr__,Transformer *this,PGPivot *pivot,bool is_pivot)

{
  pointer puVar1;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var2;
  optional_idx oVar3;
  PivotColumn *pPVar4;
  pointer pVVar5;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> uVar6;
  bool bVar7;
  int iVar8;
  pointer pPVar9;
  ParserException *pPVar10;
  InternalException *this_00;
  undefined7 in_register_00000009;
  PGList *pPVar11;
  pointer this_01;
  allocator local_f1;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_f0;
  PivotColumn *local_e8;
  undefined4 local_dc;
  PivotColumnEntry entry;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_dc = (undefined4)CONCAT71(in_register_00000009,is_pivot);
  (__return_storage_ptr__->entries).
  super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
  super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->entries).
  super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
  super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->unpivot_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->unpivot_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->pivot_expressions).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->unpivot_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->pivot_expressions).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->pivot_expressions).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->entries).
  super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
  super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->pivot_enum)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->pivot_enum).field_2;
  (__return_storage_ptr__->pivot_enum)._M_string_length = 0;
  (__return_storage_ptr__->pivot_enum).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->subquery).
  super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
  super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
  if (pivot->pivot_columns == (PGList *)0x0) {
    if (pivot->unpivot_columns == (PGList *)0x0) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&entry,"Either pivot_columns or unpivot_columns must be defined",
                 (allocator *)&local_90);
      InternalException::InternalException(this_00,(string *)&entry);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    TransformStringList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)&entry,this,pivot->unpivot_columns);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__return_storage_ptr__->unpivot_names,&entry);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&entry);
  }
  else {
    TransformExpressionList(this,pivot->pivot_columns,&__return_storage_ptr__->pivot_expressions);
    puVar1 = (__return_storage_ptr__->pivot_expressions).
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_01 = (__return_storage_ptr__->pivot_expressions).
                   super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_01 != puVar1;
        this_01 = this_01 + 1) {
      pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(this_01);
      iVar8 = (*(pPVar9->super_BaseExpression)._vptr_BaseExpression[5])(pPVar9);
      if ((char)iVar8 != '\0') {
        pPVar10 = (ParserException *)__cxa_allocate_exception(0x10);
        pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->(this_01);
        oVar3.index = (pPVar9->super_BaseExpression).query_location.index;
        ::std::__cxx11::string::string
                  ((string *)&entry,"Cannot pivot on constant value \"%s\"",(allocator *)&local_90);
        pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->(this_01);
        (*(pPVar9->super_BaseExpression)._vptr_BaseExpression[8])(&local_50,pPVar9);
        ParserException::ParserException<std::__cxx11::string>
                  (pPVar10,oVar3,(string *)&entry,&local_50);
        __cxa_throw(pPVar10,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(this_01);
      iVar8 = (*(pPVar9->super_BaseExpression)._vptr_BaseExpression[4])(pPVar9);
      if ((char)iVar8 != '\0') {
        pPVar10 = (ParserException *)__cxa_allocate_exception(0x10);
        pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->(this_01);
        oVar3.index = (pPVar9->super_BaseExpression).query_location.index;
        ::std::__cxx11::string::string
                  ((string *)&entry,"Cannot pivot on subquery \"%s\"",(allocator *)&local_90);
        pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->(this_01);
        (*(pPVar9->super_BaseExpression)._vptr_BaseExpression[8])(&local_70,pPVar9);
        ParserException::ParserException<std::__cxx11::string>
                  (pPVar10,oVar3,(string *)&entry,&local_70);
        __cxa_throw(pPVar10,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
  }
  pPVar11 = pivot->pivot_value;
  local_e8 = __return_storage_ptr__;
  if (pPVar11 != (PGList *)0x0) {
    while (pPVar11 = (PGList *)pPVar11->head, pPVar11 != (PGList *)0x0) {
      TransformExpression((Transformer *)&local_f0,
                          (optional_ptr<duckdb_libpgquery::PGNode,_true>)this);
      entry.values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      entry.expr.
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
           (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
            )0x0;
      entry.values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      entry.values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      entry.alias._M_dataplus._M_p = (pointer)&entry.alias.field_2;
      entry.alias._M_string_length = 0;
      entry.alias.field_2._M_local_buf[0] = '\0';
      unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
      operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_f0);
      ::std::__cxx11::string::_M_assign((string *)&entry.alias);
      bVar7 = TransformPivotInList
                        ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                          *)&local_f0,&entry,false);
      if (!bVar7) {
        if ((char)local_dc != '\0') {
          pPVar10 = (ParserException *)__cxa_allocate_exception(0x10);
          pPVar9 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                 *)&local_f0);
          oVar3.index = (pPVar9->super_BaseExpression).query_location.index;
          ::std::__cxx11::string::string
                    ((string *)&local_90,"PIVOT IN list must contain columns or lists of columns",
                     &local_f1);
          ParserException::ParserException<>(pPVar10,oVar3,&local_90);
          __cxa_throw(pPVar10,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::clear
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&entry);
        uVar6 = entry.expr;
        entry.expr.
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
             local_f0._M_head_impl;
        local_f0._M_head_impl = (ParsedExpression *)0x0;
        if (uVar6.
            super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
            (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
             )0x0) {
          (**(code **)(*(long *)uVar6.
                                super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                                .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>.
                                _M_head_impl + 8))();
        }
      }
      ::std::vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>::
      emplace_back<duckdb::PivotColumnEntry>
                (&(__return_storage_ptr__->entries).
                  super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>,
                 &entry);
      PivotColumnEntry::~PivotColumnEntry(&entry);
      if (local_f0._M_head_impl != (ParsedExpression *)0x0) {
        (*(code *)((Transformer *)
                  ((local_f0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->options)();
      }
    }
  }
  pPVar4 = local_e8;
  if (pivot->subquery != (PGNode *)0x0) {
    TransformSelectNode((Transformer *)&entry,(PGNode *)this,SUB81(pivot->subquery,0));
    pVVar5 = entry.values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_start;
    entry.values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    _Var2._M_head_impl =
         (pPVar4->subquery).
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pPVar4->subquery).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
    _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)pVVar5;
    if (_Var2._M_head_impl != (QueryNode *)0x0) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_QueryNode + 8))();
      if (entry.values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)&(entry.values.
                                super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                _M_impl.super__Vector_impl_data._M_start)->type_ + 8))();
      }
    }
  }
  if (pivot->pivot_enum != (char *)0x0) {
    ::std::__cxx11::string::assign((char *)&pPVar4->pivot_enum);
  }
  return pPVar4;
}

Assistant:

PivotColumn Transformer::TransformPivotColumn(duckdb_libpgquery::PGPivot &pivot, bool is_pivot) {
	PivotColumn col;
	if (pivot.pivot_columns) {
		TransformExpressionList(*pivot.pivot_columns, col.pivot_expressions);
		for (auto &expr : col.pivot_expressions) {
			if (expr->IsScalar()) {
				throw ParserException(expr->GetQueryLocation(), "Cannot pivot on constant value \"%s\"",
				                      expr->ToString());
			}
			if (expr->HasSubquery()) {
				throw ParserException(expr->GetQueryLocation(), "Cannot pivot on subquery \"%s\"", expr->ToString());
			}
		}
	} else if (pivot.unpivot_columns) {
		col.unpivot_names = TransformStringList(pivot.unpivot_columns);
	} else {
		throw InternalException("Either pivot_columns or unpivot_columns must be defined");
	}
	if (pivot.pivot_value) {
		for (auto node = pivot.pivot_value->head; node != nullptr; node = node->next) {
			auto n = PGPointerCast<duckdb_libpgquery::PGNode>(node->data.ptr_value);
			auto expr = TransformExpression(n);
			PivotColumnEntry entry;
			entry.alias = expr->GetAlias();
			auto transformed = TransformPivotInList(expr, entry);
			if (!transformed) {
				// could not transform into list of constant values
				if (is_pivot) {
					// for pivot - throw an exception
					throw ParserException(expr->GetQueryLocation(),
					                      "PIVOT IN list must contain columns or lists of columns");
				} else {
					// for unpivot - we can forward the expression immediately
					entry.values.clear();
					entry.expr = std::move(expr);
				}
			}
			col.entries.push_back(std::move(entry));
		}
	}
	if (pivot.subquery) {
		col.subquery = TransformSelectNode(*pivot.subquery);
	}
	if (pivot.pivot_enum) {
		col.pivot_enum = pivot.pivot_enum;
	}
	return col;
}